

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marry.c
# Opt level: O0

void replace_port_zero(char *addr,char *buf,int port)

{
  size_t sVar1;
  long lVar2;
  char local_38 [8];
  char num [16];
  char c;
  int iStack_20;
  _Bool colon;
  int j;
  int i;
  int port_local;
  char *buf_local;
  char *addr_local;
  
  num[0xb] = '\0';
  num[0xc] = '\0';
  num[0xd] = '\0';
  num[0xe] = '\0';
  num[0xf] = '\0';
  for (iStack_20 = 0; num[10] = addr[iStack_20], num[10] != '\0'; iStack_20 = iStack_20 + 1) {
    if ((num[0xb] == '\0') || (num[10] != '0')) {
      num[0xb] = num[10] == ':';
      buf[(int)num._12_4_] = num[10];
      num._12_4_ = num._12_4_ + 1;
    }
    else {
      snprintf(local_38,0x10,"%d",(ulong)(uint)port);
      lVar2 = (long)(int)num._12_4_;
      sVar1 = strlen(local_38);
      memcpy(buf + lVar2,local_38,sVar1);
      sVar1 = strlen(local_38);
      num[0xb] = '\0';
      num._12_4_ = (int)sVar1 + num._12_4_;
    }
  }
  buf[(int)num._12_4_] = '\0';
  return;
}

Assistant:

static void
replace_port_zero(const char *addr, char *buf, int port)
{
	int  i;
	int  j;
	bool colon = false;
	char c;

	for (i = 0, j = 0; (c = addr[i]) != '\0'; i++) {

		if (colon && c == '0') {
			char num[16];
			(void) snprintf(num, sizeof(num), "%d", port);
			memcpy(&buf[j], num, strlen(num));
			j += (int) strlen(num);
			colon = false;
			continue;
		}
		colon    = c == ':';
		buf[j++] = c;
	}
	buf[j] = '\0';
}